

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O1

QModelIndex * __thiscall QVariant::toModelIndex(QModelIndex *__return_storage_ptr__,QVariant *this)

{
  PrivateShared *pPVar1;
  ulong uVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  bool bVar6;
  long in_FS_OFFSET;
  QMetaType local_28;
  QMetaType local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QModelIndex>::metaType;
  local_28.d_ptr = (QMetaTypeInterface *)(*(ulong *)&(this->d).field_0x18 & 0xfffffffffffffffc);
  bVar6 = ::comparesEqual(&local_28,&local_20);
  if (bVar6) {
    if (((this->d).field_0x18 & 1) != 0) {
      pPVar1 = (this->d).data.shared;
      this = (QVariant *)
             ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
                     .super___atomic_base<int> + (long)pPVar1->offset);
    }
    (__return_storage_ptr__->m).ptr = *(QAbstractItemModel **)((long)&(this->d).data + 0x10);
    iVar3 = *(int *)((long)&(this->d).data + 4);
    uVar4 = *(undefined4 *)((long)&(this->d).data + 8);
    uVar5 = *(undefined4 *)((long)&(this->d).data + 0xc);
    __return_storage_ptr__->r = *(int *)&(this->d).data;
    __return_storage_ptr__->c = iVar3;
    *(undefined4 *)&__return_storage_ptr__->i = uVar4;
    *(undefined4 *)((long)&__return_storage_ptr__->i + 4) = uVar5;
  }
  else {
    *(undefined1 **)__return_storage_ptr__ = &DAT_aaaaaaaaaaaaaaaa;
    __return_storage_ptr__->i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    __return_storage_ptr__->r = -1;
    __return_storage_ptr__->c = -1;
    __return_storage_ptr__->i = 0;
    (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
    uVar2 = *(ulong *)&(this->d).field_0x18;
    if ((uVar2 & 1) != 0) {
      pPVar1 = (this->d).data.shared;
      this = (QVariant *)
             ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
                     .super___atomic_base<int> + (long)pPVar1->offset);
    }
    QMetaType::convert((QMetaTypeInterface *)(uVar2 & 0xfffffffffffffffc),this,local_20,
                       __return_storage_ptr__);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QModelIndex QVariant::toModelIndex() const
{
    return qvariant_cast<QModelIndex>(*this);
}